

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

void greatest_do_skip(char *name)

{
  char *pcVar1;
  
  if (greatest_info.verbosity == '\0') {
    fputc(0x73,_stdout);
  }
  else {
    pcVar1 = "";
    if (greatest_info.msg != (char *)0x0) {
      pcVar1 = greatest_info.msg;
    }
    fprintf(_stdout,"SKIP %s: %s",name,pcVar1);
  }
  greatest_info.suite.skipped = greatest_info.suite.skipped + 1;
  return;
}

Assistant:

int
main(int argc, char ** argv) {
    srandom(time(NULL));
    GREATEST_MAIN_BEGIN();
    RUN_SUITE(generic_pack_unpack_le);
    RUN_SUITE(generic_pack_unpack_be);
    RUN_SUITE(generic_mixed_endian);
    RUN_SUITE(plan);
    GREATEST_MAIN_END();
}